

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O3

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
::operator=(result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            *this,result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                  *other)

{
  bool bVar1;
  
  if (this->is_ok_ == true) {
    detail::region<std::vector<char,_std::allocator<char>_>_>::~region(&(this->field_1).succ.value);
  }
  bVar1 = other->is_ok_;
  if (bVar1 == true) {
    detail::region<std::vector<char,_std::allocator<char>_>_>::region
              (&(this->field_1).succ.value,&(other->field_1).succ.value);
    bVar1 = other->is_ok_;
  }
  this->is_ok_ = bVar1;
  return this;
}

Assistant:

result& operator=(result&& other)
    {
        this->cleanup();
        if(other.is_ok())
        {
            auto tmp = ::new(std::addressof(this->succ)) success_type(std::move(other.as_ok()));
            assert(tmp == std::addressof(this->succ));
            (void)tmp;
        }
        else
        {
            auto tmp = ::new(std::addressof(this->fail)) failure_type(std::move(other.as_err()));
            assert(tmp == std::addressof(this->fail));
            (void)tmp;
        }
        is_ok_ = other.is_ok();
        return *this;
    }